

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PECommander.h
# Opt level: O0

void __thiscall
PrintStringsCommand::execute(PrintStringsCommand *this,CmdParams *params,CmdContext *context)

{
  ostream *poVar1;
  allocator<char> local_61;
  string local_60;
  size_t local_40;
  size_t limit;
  size_t max;
  ResourcesContainer *container;
  PEFile *pe;
  CmdContext *context_local;
  CmdParams *params_local;
  PrintStringsCommand *this_local;
  
  pe = (PEFile *)context;
  context_local = (CmdContext *)params;
  params_local = (CmdParams *)this;
  container = (ResourcesContainer *)cmd_util::getPEFromContext(context);
  if ((PEFile *)container != (PEFile *)0x0) {
    max = (size_t)PEFile::getResourcesOfType((PEFile *)container,RESTYPE_STRING);
    if ((ResourcesContainer *)max == (ResourcesContainer *)0x0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"No such resource type!");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    else {
      limit = ResourcesContainer::entriesCount((ResourcesContainer *)max);
      poVar1 = std::operator<<((ostream *)&std::cout,"Total: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,limit);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      local_40 = 0;
      if (100 < limit) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"max",&local_61);
        local_40 = cmd_util::readNumber(&local_60,false);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
      }
      cmd_util::printStrings((PEFile *)container,local_40);
    }
  }
  return;
}

Assistant:

virtual void execute(CmdParams *params, CmdContext  *context)
    {
        PEFile *pe = cmd_util::getPEFromContext(context);
        if (!pe) return;

        ResourcesContainer* container = pe->getResourcesOfType(pe::RESTYPE_STRING);
        if (container == NULL) {
            std::cout << "No such resource type!" << std::endl;
            return;
        }
        size_t max = container->entriesCount();
        std::cout << "Total: " << max << std::endl;
        size_t limit = 0;
        if (max > 100) {
            limit = cmd_util::readNumber("max");
        }

       cmd_util::printStrings(pe, limit);
    }